

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenInitialize
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list)

{
  FieldDef *this_00;
  bool bVar1;
  reference ppFVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string local_3e8;
  undefined1 local_3c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> struct_import;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  reference local_338;
  string *im;
  _Self local_328;
  iterator it_1;
  undefined1 local_318 [8];
  string separator_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  undefined1 local_2b0 [8];
  string typing_imports;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string *local_250;
  string *code_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string field_field;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined1 local_b8 [8];
  string field_type;
  BaseType base_type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_80;
  const_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  import_typing_list;
  string code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *import_list_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)&import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&it);
  local_80._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_80);
    this_00 = *ppFVar2;
    if ((this_00->deprecated & 1U) == 0) {
      field_type.field_2._12_4_ = (this_00->value).type.base_type;
      std::__cxx11::string::string((string *)local_b8);
      switch(field_type.field_2._12_4_) {
      case 0xe:
      case 0x11:
        GenVectorInit(this,this_00,(string *)local_b8,import_list,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&it);
        break;
      case 0xf:
        GenStructInit(this,this_00,(string *)local_b8,import_list,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&it);
        break;
      case 0x10:
        GenUnionInit(this,this_00,(string *)local_b8,import_list,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&it);
        break;
      default:
        GetBasePythonTypeForScalarAndString_abi_cxx11_
                  (&local_e8,this,(BaseType *)(field_type.field_2._M_local_buf + 0xc));
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        bVar1 = FieldDef::IsScalarOptional(this_00);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&default_value.field_2 + 8),"Optional[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8);
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&default_value.field_2 + 8),"]");
          std::__cxx11::string::operator=((string *)local_b8,(string *)&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)(default_value.field_2._M_local_buf + 8));
        }
      }
      GetDefaultValue_abi_cxx11_((string *)((long)&field_field.field_2 + 8),this,this_00);
      IdlNamer::Field_abi_cxx11_((string *)local_168,&this->namer_,this_00);
      GenIndents_abi_cxx11_((string *)&code_base,this,2);
      std::operator+(&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code_base
                     ,"self.");
      std::operator+(&local_208,&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168)
      ;
      std::operator+(&local_1e8,&local_208," = ");
      std::operator+(&local_1c8,&local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&field_field.field_2 + 8));
      std::operator+(&local_1a8,&local_1c8,"  # type: ");
      std::operator+(&local_188,&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      std::__cxx11::string::operator+=
                ((string *)&import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&code_base);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)(field_field.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b8);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_80);
  }
  local_250 = code_ptr;
  GenReceiverForObjectAPI(this,struct_def,code_ptr);
  std::__cxx11::string::operator+=((string *)local_250,"__init__(self):");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)local_250,
               (string *)&import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    GenIndents_abi_cxx11_((string *)((long)&typing_imports.field_2 + 8),this,2);
    std::operator+(&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&typing_imports.field_2 + 8),"pass");
    std::__cxx11::string::operator+=((string *)local_250,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)(typing_imports.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::operator+=((string *)local_250,"\n");
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&it);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2b0,"try:",&local_2b1);
    std::allocator<char>::~allocator(&local_2b1);
    GenIndents_abi_cxx11_((string *)((long)&separator_string.field_2 + 8),this,1);
    std::operator+(&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&separator_string.field_2 + 8),"from typing import ");
    std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)(separator_string.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_318,", ",(allocator<char> *)((long)&it_1._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&it_1._M_node + 7));
    local_328._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&it);
    while( true ) {
      im = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&it);
      bVar1 = std::operator!=(&local_328,(_Self *)&im);
      if (!bVar1) break;
      local_338 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_328);
      std::operator+(&local_358,local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318)
      ;
      std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_328);
    }
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)local_2b0,lVar4 - lVar5);
    std::__cxx11::string::operator+=((string *)local_2b0,"\n");
    std::__cxx11::string::operator+=((string *)local_2b0,"except:");
    GenIndents_abi_cxx11_(&local_398,this,1);
    std::operator+(&local_378,&local_398,"pass");
    std::__cxx11::string::operator+=((string *)local_2b0,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(import_list,(value_type *)local_2b0);
    struct_import.field_2._8_8_ = pVar6.first._M_node;
    std::__cxx11::string::~string((string *)local_318);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  IdlNamer::NamespacedType_abi_cxx11_(&local_3e8,&this->namer_,&struct_def->super_Definition);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                 "import ",&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(import_list,(key_type *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&it);
  std::__cxx11::string::~string
            ((string *)&import_typing_list._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void GenInitialize(const StructDef &struct_def, std::string *code_ptr,
                     std::set<std::string> *import_list) const {
    std::string code;
    std::set<std::string> import_typing_list;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      // Determines field type, default value, and typing imports.
      auto base_type = field.value.type.base_type;
      std::string field_type;
      switch (base_type) {
        case BASE_TYPE_UNION: {
          GenUnionInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        case BASE_TYPE_STRUCT: {
          GenStructInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_ARRAY: {
          GenVectorInit(field, &field_type, import_list, &import_typing_list);
          break;
        }
        default:
          // Scalar or sting fields.
          field_type = GetBasePythonTypeForScalarAndString(base_type);
          if (field.IsScalarOptional()) {
            field_type = "Optional[" + field_type + "]";
          }
          break;
      }

      const auto default_value = GetDefaultValue(field);
      // Wrties the init statement.
      const auto field_field = namer_.Field(field);
      code += GenIndents(2) + "self." + field_field + " = " + default_value +
              "  # type: " + field_type;
    }

    // Writes __init__ method.
    auto &code_base = *code_ptr;
    GenReceiverForObjectAPI(struct_def, code_ptr);
    code_base += "__init__(self):";
    if (code.empty()) {
      code_base += GenIndents(2) + "pass";
    } else {
      code_base += code;
    }
    code_base += "\n";

    // Merges the typing imports into import_list.
    if (!import_typing_list.empty()) {
      // Adds the try statement.
      std::string typing_imports = "try:";
      typing_imports += GenIndents(1) + "from typing import ";
      std::string separator_string = ", ";
      for (auto it = import_typing_list.begin(); it != import_typing_list.end();
           ++it) {
        const std::string &im = *it;
        typing_imports += im + separator_string;
      }
      // Removes the last separator_string.
      typing_imports.erase(typing_imports.length() - separator_string.size());

      // Adds the except statement.
      typing_imports += "\n";
      typing_imports += "except:";
      typing_imports += GenIndents(1) + "pass";
      import_list->insert(typing_imports);
    }

    // Removes the import of the struct itself, if applied.
    auto struct_import = "import " + namer_.NamespacedType(struct_def);
    import_list->erase(struct_import);
  }